

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

int __thiscall HevcSpsUnit::scaling_list_data(HevcSpsUnit *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int sizeId;
  uint uVar7;
  
  for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
    uVar6 = 0x10 << ((char)uVar7 * '\x02' & 0x1fU);
    if (0x3f < uVar6) {
      uVar6 = 0x40;
    }
    for (uVar4 = 0; uVar4 < 6; uVar4 = uVar4 + (uint)(uVar7 == 3) * 2 + 1) {
      bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      if (bVar1) {
        iVar5 = uVar6 + 1;
        if ((1 < uVar7) &&
           (iVar2 = HevcUnit::extractSEGolombCode((HevcUnit *)this), 0xfe < iVar2 + 7U))
        goto LAB_0019dc24;
        while (iVar5 + -1 != 0) {
          iVar2 = HevcUnit::extractSEGolombCode((HevcUnit *)this);
          iVar5 = iVar5 + -1;
          if ((char)iVar2 != iVar2) goto LAB_0019dc24;
        }
      }
      else {
        uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (5 < uVar3) goto LAB_0019dc24;
      }
    }
  }
LAB_0019dc24:
  return (int)(uVar7 < 4);
}

Assistant:

int HevcSpsUnit::scaling_list_data()
{
    for (int sizeId = 0; sizeId < 4; sizeId++)
    {
        for (int matrixId = 0; matrixId < 6; matrixId += (sizeId == 3) ? 3 : 1)
        {
            if (!m_reader.getBit())
            {
                if (extractUEGolombCode() > 5)  // scaling_list_pred_matrix_id_delta
                    return 1;
            }
            else
            {
                const int coefNum = FFMIN(64, (1 << (4 + (sizeId << 1))));
                if (sizeId > 1)
                {
                    const int scaling_list_dc_coef = extractSEGolombCode() + 8;
                    if (scaling_list_dc_coef < 1 || scaling_list_dc_coef > 255)
                        return 1;
                }
                for (int i = 0; i < coefNum; i++)
                {
                    const int scaling_list_delta_coef = extractSEGolombCode();
                    if (scaling_list_delta_coef < -128 || scaling_list_delta_coef > 127)
                        return 1;
                }
            }
        }
    }
    return 0;
}